

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analog.cpp
# Opt level: O1

FloatSample __thiscall
MT32Emu::AccurateLowPassFilter::process(AccurateLowPassFilter *this,FloatSample inSample)

{
  int iVar1;
  uint uVar2;
  float fVar3;
  
  fVar3 = 0.0;
  if (this->phase == 0) {
    fVar3 = this->LPF_TAPS[0x30] * this->ringBuffer[this->ringBufferPosition];
  }
  iVar1 = (*(this->super_AbstractLowPassFilter<int>)._vptr_AbstractLowPassFilter[3])(this);
  if ((char)iVar1 == '\0') {
    this->ringBuffer[this->ringBufferPosition] = inSample;
  }
  iVar1 = 0;
  uVar2 = this->phase;
  do {
    fVar3 = fVar3 + this->LPF_TAPS[uVar2] * this->ringBuffer[this->ringBufferPosition + iVar1 & 0xf]
    ;
    iVar1 = iVar1 + 1;
    uVar2 = uVar2 + 3;
  } while (iVar1 != 0x10);
  uVar2 = this->phase + this->phaseIncrement;
  this->phase = uVar2;
  if (2 < uVar2) {
    this->phase = uVar2 - 3;
    this->ringBufferPosition = this->ringBufferPosition - 1 & 0xf;
  }
  return fVar3 * 3.0;
}

Assistant:

FloatSample AccurateLowPassFilter::process(const FloatSample inSample) {
	static const unsigned int DELAY_LINE_MASK = ACCURATE_LPF_DELAY_LINE_LENGTH - 1;

	FloatSample sample = (phase == 0) ? LPF_TAPS[ACCURATE_LPF_DELAY_LINE_LENGTH * ACCURATE_LPF_NUMBER_OF_PHASES] * ringBuffer[ringBufferPosition] : 0.0f;
	if (!hasNextSample()) {
		ringBuffer[ringBufferPosition] = inSample;
	}

	for (unsigned int tapIx = phase, delaySampleIx = 0; delaySampleIx < ACCURATE_LPF_DELAY_LINE_LENGTH; delaySampleIx++, tapIx += ACCURATE_LPF_NUMBER_OF_PHASES) {
		sample += LPF_TAPS[tapIx] * ringBuffer[(delaySampleIx + ringBufferPosition) & DELAY_LINE_MASK];
	}

	phase += phaseIncrement;
	if (ACCURATE_LPF_NUMBER_OF_PHASES <= phase) {
		phase -= ACCURATE_LPF_NUMBER_OF_PHASES;
		ringBufferPosition = (ringBufferPosition - 1) & DELAY_LINE_MASK;
	}

	return ACCURATE_LPF_NUMBER_OF_PHASES * sample;
}